

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadPackedFixed<unsigned_long>
          (EpsCopyInputStream *this,char *ptr,int size,RepeatedField<unsigned_long> *out)

{
  char *pcVar1;
  LogMessage *pLVar2;
  EpsCopyInputStream *local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  LogMessageFatal local_78 [23];
  Voidify local_61;
  pointer local_60;
  pointer dst;
  int local_50;
  int old_entries;
  int block_size;
  int num;
  pointer dst_1;
  int block_size_1;
  int old_entries_1;
  int num_1;
  int nbytes;
  RepeatedField<unsigned_long> *out_local;
  EpsCopyInputStream *pEStack_20;
  int size_local;
  char *ptr_local;
  EpsCopyInputStream *this_local;
  
  if (ptr == (char *)0x0) {
    this_local = (EpsCopyInputStream *)0x0;
  }
  else {
    old_entries_1 = ((int)this->buffer_end_ + 0x10) - (int)ptr;
    _num_1 = out;
    out_local._4_4_ = size;
    pEStack_20 = (EpsCopyInputStream *)ptr;
    ptr_local = (char *)this;
    while (old_entries_1 < out_local._4_4_) {
      block_size_1 = (int)((ulong)(long)old_entries_1 >> 3);
      dst_1._4_4_ = RepeatedField<unsigned_long>::size(_num_1);
      RepeatedField<unsigned_long>::Reserve(_num_1,dst_1._4_4_ + block_size_1);
      dst_1._0_4_ = block_size_1 << 3;
      _block_size = RepeatedField<unsigned_long>::AddNAlreadyReserved(_num_1,block_size_1);
      memcpy(_block_size,pEStack_20,(long)(int)dst_1);
      out_local._4_4_ = out_local._4_4_ - (int)dst_1;
      if (this->limit_ < 0x11) {
        return (char *)0x0;
      }
      pcVar1 = Next(this);
      if (pcVar1 == (char *)0x0) {
        return (char *)0x0;
      }
      pEStack_20 = (EpsCopyInputStream *)(pcVar1 + (0x10 - (old_entries_1 - (int)dst_1)));
      old_entries_1 = ((int)this->buffer_end_ + 0x10) - (int)pEStack_20;
    }
    old_entries = (int)((ulong)(long)out_local._4_4_ >> 3);
    local_50 = old_entries << 3;
    if (old_entries == 0) {
      if (out_local._4_4_ == local_50) {
        local_b0 = pEStack_20;
      }
      else {
        local_b0 = (EpsCopyInputStream *)0x0;
      }
      this_local = local_b0;
    }
    else {
      dst._4_4_ = RepeatedField<unsigned_long>::size(_num_1);
      RepeatedField<unsigned_long>::Reserve(_num_1,dst._4_4_ + old_entries);
      local_60 = RepeatedField<unsigned_long>::AddNAlreadyReserved(_num_1,old_entries);
      if (local_60 == (pointer)0x0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_88,"dst != nullptr");
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_78,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                   ,0x4a6,local_88._M_len,local_88._M_str);
        pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                           ((LogMessage *)local_78);
        pLVar2 = absl::lts_20240722::log_internal::LogMessage::
                 operator<<<google::protobuf::RepeatedField<unsigned_long>_*,_0>
                           (pLVar2,(RepeatedField<unsigned_long> **)&num_1);
        pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar2,(char (*) [2])",");
        pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar2,old_entries);
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_61,pLVar2);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_78);
      }
      memcpy(local_60,pEStack_20,(long)local_50);
      this_local = (EpsCopyInputStream *)(pEStack_20->patch_buffer_ + (long)local_50 + -0x28);
      if (out_local._4_4_ != local_50) {
        this_local = (EpsCopyInputStream *)0x0;
      }
    }
  }
  return (char *)this_local;
}

Assistant:

const char* EpsCopyInputStream::ReadPackedFixed(const char* ptr, int size,
                                                RepeatedField<T>* out) {
  GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
  int nbytes = static_cast<int>(buffer_end_ + kSlopBytes - ptr);
  while (size > nbytes) {
    int num = nbytes / sizeof(T);
    int old_entries = out->size();
    out->Reserve(old_entries + num);
    int block_size = num * sizeof(T);
    auto dst = out->AddNAlreadyReserved(num);
#ifdef ABSL_IS_LITTLE_ENDIAN
    std::memcpy(dst, ptr, block_size);
#else
    for (int i = 0; i < num; i++)
      dst[i] = UnalignedLoad<T>(ptr + i * sizeof(T));
#endif
    size -= block_size;
    if (limit_ <= kSlopBytes) return nullptr;
    ptr = Next();
    if (ptr == nullptr) return nullptr;
    ptr += kSlopBytes - (nbytes - block_size);
    nbytes = static_cast<int>(buffer_end_ + kSlopBytes - ptr);
  }
  int num = size / sizeof(T);
  int block_size = num * sizeof(T);
  if (num == 0) return size == block_size ? ptr : nullptr;
  int old_entries = out->size();
  out->Reserve(old_entries + num);
  auto dst = out->AddNAlreadyReserved(num);
#ifdef ABSL_IS_LITTLE_ENDIAN
  ABSL_CHECK(dst != nullptr) << out << "," << num;
  std::memcpy(dst, ptr, block_size);
#else
  for (int i = 0; i < num; i++) dst[i] = UnalignedLoad<T>(ptr + i * sizeof(T));
#endif
  ptr += block_size;
  if (size != block_size) return nullptr;
  return ptr;
}